

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O1

void vsnapshot_tilde_bang(t_vsnapshot *x)

{
  int iVar1;
  long lVar2;
  int iVar3;
  t_sample f;
  double dVar4;
  
  if (x->x_gotone == 0) {
    f = 0.0;
  }
  else {
    dVar4 = clock_gettimesince(x->x_time);
    iVar1 = (int)((double)x->x_sampspermsec * dVar4);
    if (iVar1 < 0) {
      lVar2 = 0;
    }
    else {
      iVar3 = x->x_n + -1;
      if (iVar1 < x->x_n) {
        iVar3 = iVar1;
      }
      lVar2 = (long)iVar3;
    }
    f = x->x_vec[lVar2];
  }
  outlet_float((x->x_obj).te_outlet,f);
  return;
}

Assistant:

static void vsnapshot_tilde_bang(t_vsnapshot *x)
{
    t_sample val;
    if (x->x_gotone)
    {
        int indx = clock_gettimesince(x->x_time) * x->x_sampspermsec;
        if (indx < 0)
            indx = 0;
        else if (indx >= x->x_n)
            indx = x->x_n - 1;
        val = x->x_vec[indx];
    }
    else val = 0;
    outlet_float(x->x_obj.ob_outlet, val);
}